

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EfiTianoCompress.c
# Opt level: O3

void WritePTLen(INT32 Number,INT32 nbit,INT32 Special)

{
  char *pcVar1;
  byte bVar2;
  int iVar3;
  ulong uVar4;
  UINT32 Value;
  uint Value_00;
  int iVar5;
  int iVar6;
  long lVar7;
  
  uVar4 = (ulong)(uint)Number;
  Value = Number + 1;
  do {
    if ((int)uVar4 < 1) {
      PutBits(nbit,Number >> 0x1f & Number);
      return;
    }
    Value = Value - 1;
    pcVar1 = &DAT_002ba00f + uVar4;
    uVar4 = uVar4 - 1;
  } while (*pcVar1 == '\0');
  PutBits(nbit,Value);
  iVar5 = 0;
  do {
    lVar7 = (long)iVar5;
    bVar2 = mPTLen[lVar7];
    if (bVar2 < 7) {
      iVar3 = 3;
      Value_00 = (uint)bVar2;
    }
    else {
      iVar3 = bVar2 - 3;
      Value_00 = (1 << ((byte)iVar3 & 0x1f)) - 2;
    }
    PutBits(iVar3,Value_00);
    iVar3 = iVar5 + 1;
    if (iVar3 == Special) {
      iVar6 = Special;
      if (iVar5 < 5) {
        do {
          iVar6 = iVar3;
          if (mPTLen[lVar7 + 1] != '\0') goto LAB_001a1863;
          lVar7 = lVar7 + 1;
          iVar3 = iVar6 + 1;
        } while (lVar7 != 5);
        iVar6 = 6;
      }
LAB_001a1863:
      PutBits(2,iVar6 + 1U & 3);
      iVar3 = iVar6;
    }
    iVar5 = iVar3;
    if ((int)Value <= iVar5) {
      return;
    }
  } while( true );
}

Assistant:

STATIC 
VOID 
WritePTLen (
  IN INT32 n, 
  IN INT32 nbit, 
  IN INT32 Special
  )
/*++

Routine Description:

  Outputs the code length array for the Extra Set or the Position Set.
  
Arguments:

  n       - the number of symbols
  nbit    - the number of bits needed to represent 'n'
  Special - the special symbol that needs to be take care of
  
Returns: (VOID)

--*/
{
  INT32 i, k;

  while (n > 0 && mPTLen[n - 1] == 0) {
    n--;
  }
  PutBits(nbit, n);
  i = 0;
  while (i < n) {
    k = mPTLen[i++];
    if (k <= 6) {
      PutBits(3, k);
    } else {
      PutBits(k - 3, (1U << (k - 3)) - 2);
    }
    if (i == Special) {
      while (i < 6 && mPTLen[i] == 0) {
        i++;
      }
      PutBits(2, (i - 3) & 3);
    }
  }
}